

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O2

void __thiscall HawkTracer::parser::ProtocolReader::wait_for_complete(ProtocolReader *this)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->_mtx_cv);
  while (((this->_is_running)._M_base._M_i & 1U) != 0) {
    std::condition_variable::wait((unique_lock *)&this->_cv);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

void ProtocolReader::wait_for_complete()
{
    std::unique_lock<std::mutex> l(_mtx_cv);
    _cv.wait(l, [this] { return !_is_running; });
}